

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O1

string * __thiscall
HevcSpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,HevcSpsUnit *this)

{
  ulong *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  double fps;
  string local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  string local_50;
  
  HevcUnitWithProfile::getProfileString_abi_cxx11_
            (__return_storage_ptr__,&this->super_HevcUnitWithProfile);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," Resolution: ","");
  int32uToStr_abi_cxx11_(&local_50,&this->pic_width_in_luma_samples);
  uVar5 = 0xf;
  if (local_b0 != local_a0) {
    uVar5 = local_a0[0];
  }
  if (uVar5 < local_50._M_string_length + local_a8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar6 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_50._M_string_length + local_a8) goto LAB_0018b5a4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0018b5a4:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_c0 = *puVar1;
    uStack_b8 = *(undefined4 *)(puVar4 + 3);
    uStack_b4 = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_c0 = *puVar1;
    local_d0 = (ulong *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,":","");
  uVar5 = 0xf;
  if (local_d0 != &local_c0) {
    uVar5 = local_c0;
  }
  if (uVar5 < (ulong)(local_88 + local_c8)) {
    uVar5 = 0xf;
    if (local_90 != local_80) {
      uVar5 = local_80[0];
    }
    if (uVar5 < (ulong)(local_88 + local_c8)) goto LAB_0018b683;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_0018b683:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
  }
  local_f0 = &local_e0;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar4[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (ulong *)*puVar4;
  }
  local_e8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  int32uToStr_abi_cxx11_(&local_70,&this->pic_height_in_luma_samples);
  uVar5 = 0xf;
  if (local_f0 != &local_e0) {
    uVar5 = local_e0;
  }
  if (uVar5 < local_70._M_string_length + local_e8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_e8 <= (ulong)uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0018b774;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70._M_dataplus._M_p);
LAB_0018b774:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_8_ = puVar4[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_110._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_110._M_dataplus._M_p);
  paVar3 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  local_110._M_dataplus._M_p = (pointer)paVar3;
  if ((this->super_HevcUnitWithProfile).interlaced_source_flag == true) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"i","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p","");
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_110._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_f0 = (ulong *)0x0;
  if (this->num_units_in_tick != 0) {
    local_f0 = (ulong *)((double)this->time_scale / (double)this->num_units_in_tick);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (((double)local_f0 != 0.0) || (NAN((double)local_f0))) {
    doubleToStr_abi_cxx11_(&local_110,(double *)&local_f0,-1);
  }
  else {
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"not found","");
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_110._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string HevcSpsUnit::getDescription() const
{
    string result = getProfileString();
    result += string(" Resolution: ") + int32uToStr(pic_width_in_luma_samples) + string(":") +
              int32uToStr(pic_height_in_luma_samples);
    result += interlaced_source_flag ? string("i") : string("p");

    const double fps = getFPS();
    result += "  Frame rate: ";
    result += fps != 0.0 ? doubleToStr(fps) : string("not found");
    return result;
}